

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

Error __thiscall
asmjit::BaseCompiler::_newReg(BaseCompiler *this,BaseReg *out,uint32_t typeId,char *name)

{
  uint32_t uVar1;
  Error EVar2;
  RegInfo regInfo;
  VirtReg *vReg;
  RegInfo local_28;
  uint32_t local_24;
  VirtReg *local_20;
  
  (out->super_Operand).super_Operand_._signature = 0;
  (out->super_Operand).super_Operand_._baseId = 0;
  (out->super_Operand).super_Operand_._data[0] = 0;
  (out->super_Operand).super_Operand_._data[1] = 0;
  local_24 = typeId;
  EVar2 = ArchUtils::typeIdToRegInfo
                    ((uint)(this->super_BaseBuilder).super_BaseEmitter._environment._arch,typeId,
                     &local_24,&local_28);
  if (EVar2 == 0) {
    EVar2 = newVirtReg(this,&local_20,local_24,local_28._signature,name);
    if (EVar2 == 0) {
      uVar1 = local_20->_id;
      (out->super_Operand).super_Operand_._signature = local_28._signature;
      (out->super_Operand).super_Operand_._baseId = uVar1;
      (out->super_Operand).super_Operand_._data[0] = 0;
      (out->super_Operand).super_Operand_._data[1] = 0;
    }
  }
  else {
    EVar2 = BaseEmitter::reportError((BaseEmitter *)this,EVar2,(char *)0x0);
  }
  return EVar2;
}

Assistant:

Error BaseCompiler::_newReg(BaseReg* out, uint32_t typeId, const char* name) {
  RegInfo regInfo;
  out->reset();

  Error err = ArchUtils::typeIdToRegInfo(arch(), typeId, &typeId, &regInfo);
  if (ASMJIT_UNLIKELY(err))
    return reportError(err);

  VirtReg* vReg;
  ASMJIT_PROPAGATE(newVirtReg(&vReg, typeId, regInfo.signature(), name));

  out->_initReg(regInfo.signature(), vReg->id());
  return kErrorOk;
}